

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorKeyReference::DescriptorKeyReference
          (DescriptorKeyReference *this,SchnorrPubkey *schnorr_pubkey)

{
  Pubkey local_40;
  SchnorrPubkey *local_18;
  SchnorrPubkey *schnorr_pubkey_local;
  DescriptorKeyReference *this_local;
  
  this->key_type_ = kDescriptorKeySchnorr;
  local_18 = schnorr_pubkey;
  schnorr_pubkey_local = (SchnorrPubkey *)this;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_,schnorr_pubkey);
  Pubkey::Pubkey(&this->pubkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  KeyData::KeyData(&this->key_data_);
  ::std::__cxx11::string::string((string *)&this->argument_);
  SchnorrPubkey::CreatePubkey(&local_40,local_18,false);
  Pubkey::operator=(&this->pubkey_,&local_40);
  Pubkey::~Pubkey(&local_40);
  return;
}

Assistant:

DescriptorKeyReference::DescriptorKeyReference(
    const SchnorrPubkey& schnorr_pubkey)
    : key_type_(DescriptorKeyType::kDescriptorKeySchnorr),
      schnorr_pubkey_(schnorr_pubkey) {
  pubkey_ = schnorr_pubkey.CreatePubkey();
}